

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

int co_poll_inner(stCoEpoll_t *ctx,pollfd *fds,nfds_t nfds,int timeout,poll_pfn_t pollfunc)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  stCoRoutine_t *psVar5;
  stTimeoutItem_t *apItem;
  stTimeoutItem_t *psVar6;
  stTimeoutItemLink_t *psVar7;
  stCoRoutineEnv_t *psVar8;
  int *piVar9;
  unsigned_long_long allNow;
  long *in_FS_OFFSET;
  ulong uStack_150;
  int fd;
  nfds_t i_1;
  int iRaiseCnt;
  int ret;
  unsigned_long_long now;
  int ret_1;
  epoll_event *ev;
  nfds_t i;
  size_t num_active;
  stPollItem_t arr [2];
  stPoll_t *arg;
  stCoRoutine_t *self;
  int epfd;
  poll_pfn_t pollfunc_local;
  int timeout_local;
  nfds_t nfds_local;
  pollfd *fds_local;
  stCoEpoll_t *ctx_local;
  
  if (timeout == 0) {
    ctx_local._4_4_ = (*pollfunc)(fds,nfds,0);
  }
  else {
    pollfunc_local._4_4_ = timeout;
    if (timeout < 0) {
      pollfunc_local._4_4_ = 0x7fffffff;
    }
    iVar3 = ctx->iEpollFd;
    psVar5 = co_self();
    apItem = (stTimeoutItem_t *)malloc(0x68);
    memset(apItem,0,0x68);
    *(int *)((long)&apItem[1].ullExpireTime + 4) = iVar3;
    psVar6 = (stTimeoutItem_t *)calloc(nfds,8);
    apItem[1].pPrev = psVar6;
    apItem[1].pNext = (stTimeoutItem_t *)nfds;
    if ((nfds < 2) && (psVar5->cIsShareStack == '\0')) {
      apItem[1].pLink = (stTimeoutItemLink_t *)&num_active;
    }
    else {
      psVar7 = (stTimeoutItemLink_t *)malloc(nfds * 0x60);
      apItem[1].pLink = psVar7;
    }
    memset(apItem[1].pLink,0,nfds * 0x60);
    apItem->pfnProcess = OnPollProcessEvent;
    psVar8 = co_get_curr_thread_env();
    psVar5 = GetCurrCo(psVar8);
    apItem->pArg = psVar5;
    i = 0;
    for (ev = (epoll_event *)0x0; ev < nfds; ev = (epoll_event *)((long)&ev->events + 1)) {
      apItem[1].pLink[(long)ev * 6 + 4].head =
           (stTimeoutItem_t *)(&(apItem[1].pPrev)->pPrev + (long)ev);
      apItem[1].pLink[(long)ev * 6 + 4].tail = apItem;
      apItem[1].pLink[(long)ev * 6 + 2].head = (stTimeoutItem_t *)OnPollPreparePfn;
      psVar7 = apItem[1].pLink + (long)ev * 6 + 5;
      if (-1 < fds[(long)ev].fd) {
        *(stTimeoutItemLink_t **)((long)&apItem[1].pLink[(long)ev * 6 + 5].head + 4) =
             apItem[1].pLink + (long)ev * 6;
        uVar1 = PollEvent2Epoll(fds[(long)ev].events);
        *(uint32_t *)&psVar7->head = uVar1;
        iVar2 = co_epoll_ctl(iVar3,1,fds[(long)ev].fd,(epoll_event *)psVar7);
        if ((((iVar2 < 0) && (piVar9 = __errno_location(), *piVar9 == 1)) && (nfds == 1)) &&
           (pollfunc != (poll_pfn_t)0x0)) {
          if (apItem[1].pLink != (stTimeoutItemLink_t *)&num_active) {
            free(apItem[1].pLink);
            apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
          }
          free(apItem[1].pPrev);
          free(apItem);
          iVar3 = (*pollfunc)(fds,1,pollfunc_local._4_4_);
          return iVar3;
        }
        i = i + 1;
      }
    }
    allNow = GetTickMS();
    apItem->ullExpireTime = allNow + (long)(int)pollfunc_local._4_4_;
    uVar4 = AddTimeout(ctx->pTimeout,apItem,allNow);
    if ((uVar4 == 0) || (uVar4 == 0xffffffff)) {
      *(long *)(*in_FS_OFFSET + -8) = i + *(long *)(*in_FS_OFFSET + -8);
      psVar8 = co_get_curr_thread_env();
      co_yield_env(psVar8);
      *(long *)(*in_FS_OFFSET + -8) = *(long *)(*in_FS_OFFSET + -8) - i;
      i_1._0_4_ = *(int *)&apItem[1].pfnPrepare;
    }
    else {
      co_log_err("CO_ERR: AddTimeout ret %d now %lld timeout %d arg.ullExpireTime %lld",(ulong)uVar4
                 ,allNow,(ulong)pollfunc_local._4_4_,apItem->ullExpireTime);
      piVar9 = __errno_location();
      *piVar9 = 0x16;
      i_1._0_4_ = -1;
    }
    RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(apItem);
    for (uStack_150 = 0; uStack_150 < nfds; uStack_150 = uStack_150 + 1) {
      if (-1 < fds[uStack_150].fd) {
        co_epoll_ctl(iVar3,2,fds[uStack_150].fd,
                     (epoll_event *)(apItem[1].pLink + uStack_150 * 6 + 5));
      }
      fds[uStack_150].revents = *(short *)((long)&(apItem[1].pPrev)->pPrev + uStack_150 * 8 + 6);
    }
    if (apItem[1].pLink != (stTimeoutItemLink_t *)&num_active) {
      free(apItem[1].pLink);
      apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
    }
    free(apItem[1].pPrev);
    free(apItem);
    ctx_local._4_4_ = (int)i_1;
  }
  return ctx_local._4_4_;
}

Assistant:

int co_poll_inner( stCoEpoll_t *ctx,struct pollfd fds[], nfds_t nfds, int timeout, poll_pfn_t pollfunc)
{
    if (timeout == 0)
	{
		return pollfunc(fds, nfds, timeout);
	}
	if (timeout < 0)
	{
		timeout = INT_MAX;
	}
	int epfd = ctx->iEpollFd;
	stCoRoutine_t* self = co_self();

	//1.struct change
	stPoll_t& arg = *((stPoll_t*)malloc(sizeof(stPoll_t)));
	memset( &arg,0,sizeof(arg) );

	arg.iEpollFd = epfd;
	arg.fds = (pollfd*)calloc(nfds, sizeof(pollfd));
	arg.nfds = nfds;

	stPollItem_t arr[2];
	if( nfds < sizeof(arr) / sizeof(arr[0]) && !self->cIsShareStack)
	{
		arg.pPollItems = arr;
	}	
	else
	{
		arg.pPollItems = (stPollItem_t*)malloc( nfds * sizeof( stPollItem_t ) );
	}
	memset( arg.pPollItems,0,nfds * sizeof(stPollItem_t) );

	arg.pfnProcess = OnPollProcessEvent;
	arg.pArg = GetCurrCo( co_get_curr_thread_env() );
	
	size_t num_active = 0;
	//2. add epoll
	for(nfds_t i=0;i<nfds;i++)
	{
		arg.pPollItems[i].pSelf = arg.fds + i;
		arg.pPollItems[i].pPoll = &arg;

		arg.pPollItems[i].pfnPrepare = OnPollPreparePfn;
		struct epoll_event &ev = arg.pPollItems[i].stEvent;

		if( fds[i].fd > -1 )
		{
			ev.data.ptr = arg.pPollItems + i;
			ev.events = PollEvent2Epoll( fds[i].events );

			int ret = co_epoll_ctl( epfd,EPOLL_CTL_ADD, fds[i].fd, &ev );
			if (ret < 0 && errno == EPERM && nfds == 1 && pollfunc != NULL)
			{
				if( arg.pPollItems != arr )
				{
					free( arg.pPollItems );
					arg.pPollItems = NULL;
				}
				free(arg.fds);
				free(&arg);
				return pollfunc(fds, nfds, timeout);
			}
			num_active++;
		}
		//if fail,the timeout would work
	}

	//3.add timeout

	unsigned long long now = GetTickMS();
	arg.ullExpireTime = now + timeout;
	int ret = AddTimeout( ctx->pTimeout,&arg,now );
	int iRaiseCnt = 0;
	if( ret != 0 && ret!=-1){
		co_log_err("CO_ERR: AddTimeout ret %d now %lld timeout %d arg.ullExpireTime %lld",
				ret,now,timeout,arg.ullExpireTime);
		errno = EINVAL;
		iRaiseCnt = -1;

	}
    else
	{
		_num_co_routines_active += num_active;
		co_yield_env( co_get_curr_thread_env() );
		_num_co_routines_active -= num_active;
		iRaiseCnt = arg.iRaiseCnt;
	}

    {
		//clear epoll status and memory
		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( &arg );
		for(nfds_t i = 0;i < nfds;i++)
		{
			int fd = fds[i].fd;
			if( fd > -1 )
			{
				co_epoll_ctl( epfd,EPOLL_CTL_DEL,fd,&arg.pPollItems[i].stEvent );
			}
			fds[i].revents = arg.fds[i].revents;
		}


		if( arg.pPollItems != arr )
		{
			free( arg.pPollItems );
			arg.pPollItems = NULL;
		}

		free(arg.fds);
		free(&arg);
	}

	return iRaiseCnt;
}